

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_3,_3>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_3,_3>_> *this,EvalContext *ctx)

{
  bool *pbVar1;
  Environment *this_00;
  Variable<tcu::Matrix<float,_3,_3>_> *variable;
  Expr<tcu::Matrix<float,_3,_3>_> *pEVar2;
  double dVar3;
  Interval *pIVar4;
  int row;
  long lVar5;
  long lVar6;
  IVal *pIVar7;
  IVal local_f8;
  
  pIVar7 = &local_f8;
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.
               m_ptr;
    pEVar2 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr;
    (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_f8,pEVar2,ctx);
    Environment::bind<tcu::Matrix<float,3,3>>(this_00,variable,&local_f8);
  }
  else {
    pEVar2 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr;
    (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_f8,pEVar2,ctx);
    pIVar4 = (Interval *)
             Environment::lookup<tcu::Matrix<float,3,3>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                                 .m_ptr);
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)&pIVar4->m_hi + lVar6) = *(undefined8 *)((long)pIVar7 + lVar6 + 0x10);
        dVar3 = (double)((undefined8 *)((long)pIVar7 + lVar6))[1];
        pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&pIVar4->m_hasNaN)->m_data[0].m_data
                  [0].m_hasNaN + lVar6;
        *(undefined8 *)pbVar1 = *(undefined8 *)((long)pIVar7 + lVar6);
        *(double *)(pbVar1 + 8) = dVar3;
        lVar6 = lVar6 + 0x48;
      } while (lVar6 != 0xd8);
      lVar5 = lVar5 + 1;
      pIVar4 = pIVar4 + 1;
      pIVar7 = (IVal *)((long)pIVar7 + 0x18);
    } while (lVar5 != 3);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}